

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionBody.cpp
# Opt level: O2

void __thiscall Js::FunctionProxy::UpdateFunctionBodyImpl(FunctionProxy *this,FunctionBody *body)

{
  FunctionInfo *ptr;
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  
  ptr = (this->functionInfo).ptr;
  if ((ptr->functionBodyImpl).ptr != this) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
                                ,0x80b,"(functionInfo->GetFunctionProxy() == this)",
                                "functionInfo->GetFunctionProxy() == this");
    if (!bVar2) goto LAB_006c6be7;
    *puVar3 = 0;
  }
  bVar2 = IsFunctionBody(this);
  if (body != (FunctionBody *)this && bVar2) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
                                ,0x80c,"(!this->IsFunctionBody() || body == this)",
                                "!this->IsFunctionBody() || body == this");
    if (!bVar2) {
LAB_006c6be7:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
  }
  Memory::WriteBarrierPtr<Js::FunctionProxy>::WriteBarrierSet
            (&ptr->functionBodyImpl,(FunctionProxy *)body);
  Memory::WriteBarrierPtr<Js::FunctionInfo>::WriteBarrierSet
            (&(body->super_ParseableFunctionInfo).super_FunctionProxy.functionInfo,ptr);
  SetAttributes((FunctionProxy *)body,ptr->attributes & ~(DeferredParse|DeferredDeserialize));
  return;
}

Assistant:

void
    FunctionProxy::UpdateFunctionBodyImpl(FunctionBody * body)
    {
        FunctionInfo *functionInfo = this->GetFunctionInfo();
        Assert(functionInfo->GetFunctionProxy() == this);
        Assert(!this->IsFunctionBody() || body == this);
        functionInfo->SetFunctionProxy(body);
        body->SetFunctionInfo(functionInfo);
        body->SetAttributes((FunctionInfo::Attributes)(functionInfo->GetAttributes() & ~(FunctionInfo::Attributes::DeferredParse | FunctionInfo::Attributes::DeferredDeserialize)));
    }